

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O2

QToken * queryparse::transform_hexbyte(QToken *__return_storage_ptr__,node *atom)

{
  char hexchar;
  uint8_t val;
  int iVar1;
  string local_38;
  
  tao::pegtl::parse_tree::default_node_content::content_abi_cxx11_
            (&local_38,
             &(atom->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content);
  hexchar = local_38._M_dataplus._M_p[1];
  if (*local_38._M_dataplus._M_p == '?') {
    if (hexchar == '?') {
      QToken::wildcard();
    }
    else {
      iVar1 = hex2int(hexchar);
      QToken::high_wildcard(__return_storage_ptr__,(uint8_t)iVar1);
    }
  }
  else if (hexchar == '?') {
    iVar1 = hex2int(*local_38._M_dataplus._M_p);
    QToken::low_wildcard(__return_storage_ptr__,(char)iVar1 << 4);
  }
  else {
    val = transform_char(atom);
    QToken::single(__return_storage_ptr__,val);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

QToken transform_hexbyte(const parse_tree::node &atom) {
    const std::string &c = atom.content();

    if (c[0] == '?' && c[1] == '?') {  // \x??
        return QToken::wildcard();
    }
    if (c[0] == '?') {  // \x?A
        return QToken::high_wildcard(hex2int(c[1]));
    }
    if (c[1] == '?') {  // \xA?
        return QToken::low_wildcard(hex2int(c[0]) << 4U);
    }
    return QToken::single(transform_char(atom));
}